

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O2

void partial_suite::format_boolean(void)

{
  value_type expected [3];
  undefined1 local_b9;
  buffer_type_conflict result;
  variable data;
  writer writer;
  
  data.storage.current = '\x01';
  data.storage.storage.__data[0] = '\x01';
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&writer,&result);
  trial::protocol::bintoken::basic_writer<16UL>::
  overloader<trial::protocol::bintoken::token::begin_record,_void>::value(&writer);
  trial::protocol::bintoken::partial::format<std::allocator<char>>(&data,&writer);
  trial::protocol::bintoken::basic_writer<16UL>::
  overloader<trial::protocol::bintoken::token::end_record,_void>::value(&writer);
  expected[2] = 0x91;
  expected[0] = 0x90;
  expected[1] = 0x81;
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x1d1,"void partial_suite::format_boolean()",
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,expected,&local_b9);
  trial::protocol::bintoken::basic_writer<16UL>::~basic_writer(&writer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void format_boolean()
{
    variable data(true);
    buffer_type result;
    bintoken::writer writer(result);
    writer.value<bintoken::token::begin_record>();
    bintoken::partial::format(data, writer);
    writer.value<bintoken::token::end_record>();
    const value_type expected[] = {
        bintoken::token::code::begin_record,
        bintoken::token::code::true_value,
        bintoken::token::code::end_record
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}